

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O2

string * csv_printer::escape_csv(string *__return_storage_ptr__,string *field)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\"",&local_31);
  pcVar1 = (field->_M_dataplus)._M_p;
  sVar2 = field->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    if (pcVar1[sVar3] == '\"') {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape_csv(const std::string & field) {
        std::string escaped = "\"";
        for (auto c : field) {
            if (c == '"') {
                escaped += "\"";
            }
            escaped += c;
        }
        escaped += "\"";
        return escaped;
    }